

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::CleanupSourceInfo(FunctionBody *this,bool isScriptContextClosing)

{
  SmallSpanSequence *obj;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Utf8SourceInfo *this_00;
  
  uVar3 = *(uint *)&this->field_0x178;
  if ((uVar3 >> 9 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ceb,"(this->cleanedUp)","this->cleanedUp");
    if (!bVar2) goto LAB_00770b12;
    *puVar4 = 0;
    uVar3 = *(uint *)&this->field_0x178;
  }
  if ((uVar3 >> 10 & 1) == 0) {
    if ((uVar3 & 8) != 0 && !isScriptContextClosing) {
      this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
      if (this_00 == (Utf8SourceInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x1cf3,"(this->m_utf8SourceInfo)","this->m_utf8SourceInfo");
        if (!bVar2) {
LAB_00770b12:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
      }
      Utf8SourceInfo::RemoveFunctionBody(this_00,this);
    }
    obj = (this->m_sourceInfo).pSpanSequence;
    if (obj != (SmallSpanSequence *)0x0) {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::SmallSpanSequence>
                (&Memory::HeapAllocator::Instance,obj);
      (this->m_sourceInfo).pSpanSequence = (Type)0x0;
    }
    this->field_0x179 = this->field_0x179 | 4;
  }
  return;
}

Assistant:

void FunctionBody::CleanupSourceInfo(bool isScriptContextClosing)
    {
        Assert(this->cleanedUp);

        if (!sourceInfoCleanedUp)
        {
            if (GetIsFuncRegistered() && !isScriptContextClosing)
            {
                // If our function is registered, then there must
                // be a Utf8SourceInfo pinned by it.
                Assert(this->m_utf8SourceInfo);

                this->GetUtf8SourceInfo()->RemoveFunctionBody(this);
            }

            if (this->m_sourceInfo.pSpanSequence != nullptr)
            {
                HeapDelete(this->m_sourceInfo.pSpanSequence);
                this->m_sourceInfo.pSpanSequence = nullptr;
            }

            sourceInfoCleanedUp = true;
        }
    }